

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::portmap_alert::portmap_alert
          (portmap_alert *this,stack_allocator *param_1,port_mapping_t i,int port,
          portmap_transport t,portmap_protocol proto)

{
  rep rVar1;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00455710;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar1;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_004563d0;
  (this->mapping).m_val = i.m_val;
  this->external_port = port;
  this->map_protocol = proto;
  this->map_transport = t;
  this->protocol = CONCAT31(in_register_00000089,proto);
  this->map_type = CONCAT31(in_register_00000081,t);
  return;
}

Assistant:

portmap_alert::portmap_alert(aux::stack_allocator&, port_mapping_t const i
		, int port
		, portmap_transport const t
		, portmap_protocol const proto)
		: mapping(i)
		, external_port(port)
		, map_protocol(proto)
		, map_transport(t)
#if TORRENT_ABI_VERSION == 1
		, protocol(static_cast<int>(proto))
		, map_type(static_cast<int>(t))
#endif
	{}